

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputRequiredFilesCommand.cxx
# Opt level: O3

void __thiscall
cmOutputRequiredFilesCommand::ListDependencies
          (cmOutputRequiredFilesCommand *this,cmDependInformation *info,FILE *fout,
          set<const_cmDependInformation_*,_std::less<const_cmDependInformation_*>,_std::allocator<const_cmDependInformation_*>_>
          *visited)

{
  ulong uVar1;
  int iVar2;
  _Rb_tree_header *p_Var3;
  long lVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  cmDependInformation *pcVar8;
  string tmp;
  long *local_80 [2];
  long local_70 [2];
  cmOutputRequiredFilesCommand *local_60;
  long *local_58 [2];
  long local_48 [2];
  cmDependInformation *local_38;
  
  local_60 = this;
  local_38 = info;
  std::
  _Rb_tree<cmDependInformation_const*,cmDependInformation_const*,std::_Identity<cmDependInformation_const*>,std::less<cmDependInformation_const*>,std::allocator<cmDependInformation_const*>>
  ::_M_insert_unique<cmDependInformation_const*const&>
            ((_Rb_tree<cmDependInformation_const*,cmDependInformation_const*,std::_Identity<cmDependInformation_const*>,std::less<cmDependInformation_const*>,std::allocator<cmDependInformation_const*>>
              *)visited,&local_38);
  p_Var5 = (local_38->DependencySet)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)p_Var5 != &(local_38->DependencySet)._M_t._M_impl.super__Rb_tree_header) {
    p_Var3 = &(visited->_M_t)._M_impl.super__Rb_tree_header;
    pcVar8 = local_38;
    do {
      p_Var6 = (visited->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (p_Var6 == (_Base_ptr)0x0) {
LAB_0035b81c:
        iVar2 = std::__cxx11::string::compare((char *)&pcVar8->FullPath);
        if (iVar2 != 0) {
          lVar4 = *(long *)(*(long *)(p_Var5 + 1) + 0x40);
          local_80[0] = local_70;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_80,lVar4,*(long *)(*(long *)(p_Var5 + 1) + 0x48) + lVar4);
          lVar4 = std::__cxx11::string::rfind((char)(string *)local_80,0x2e);
          if (lVar4 != -1) {
            std::__cxx11::string::substr((ulong)local_58,(ulong)local_80);
            iVar2 = std::__cxx11::string::compare((char *)local_58);
            if (local_58[0] != local_48) {
              operator_delete(local_58[0],local_48[0] + 1);
            }
            if (iVar2 != 0) {
              std::__cxx11::string::substr((ulong)local_58,(ulong)local_80);
              std::__cxx11::string::operator=((string *)local_80,(string *)local_58);
              if (local_58[0] != local_48) {
                operator_delete(local_58[0],local_48[0] + 1);
              }
              fprintf((FILE *)fout,"%s\n",*(undefined8 *)(*(long *)(p_Var5 + 1) + 0x40));
            }
          }
          if (local_80[0] != local_70) {
            operator_delete(local_80[0],local_70[0] + 1);
          }
        }
        ListDependencies(local_60,*(cmDependInformation **)(p_Var5 + 1),fout,visited);
        pcVar8 = local_38;
      }
      else {
        uVar1 = *(ulong *)(p_Var5 + 1);
        p_Var7 = &p_Var3->_M_header;
        do {
          if (*(ulong *)(p_Var6 + 1) >= uVar1) {
            p_Var7 = p_Var6;
          }
          p_Var6 = (&p_Var6->_M_left)[*(ulong *)(p_Var6 + 1) < uVar1];
        } while (p_Var6 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var7 == p_Var3) || (uVar1 < *(ulong *)(p_Var7 + 1)))
        goto LAB_0035b81c;
      }
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while ((_Rb_tree_header *)p_Var5 !=
             &(pcVar8->DependencySet)._M_t._M_impl.super__Rb_tree_header);
  }
  return;
}

Assistant:

void cmOutputRequiredFilesCommand::ListDependencies(
  cmDependInformation const* info, FILE* fout,
  std::set<cmDependInformation const*>* visited)
{
  // add info to the visited set
  visited->insert(info);
  // now recurse with info's dependencies
  for (cmDependInformation::DependencySetType::const_iterator d =
         info->DependencySet.begin();
       d != info->DependencySet.end(); ++d) {
    if (visited->find(*d) == visited->end()) {
      if (info->FullPath != "") {
        std::string tmp = (*d)->FullPath;
        std::string::size_type pos = tmp.rfind('.');
        if (pos != std::string::npos && (tmp.substr(pos) != ".h")) {
          tmp = tmp.substr(0, pos);
          fprintf(fout, "%s\n", (*d)->FullPath.c_str());
        }
      }
      this->ListDependencies(*d, fout, visited);
    }
  }
}